

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::isScalarConstructor(HlslParseContext *this,TIntermNode *node)

{
  int iVar1;
  uint uVar2;
  TOperator TVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  bool local_1a;
  bool local_19;
  TIntermNode *node_local;
  HlslParseContext *this_local;
  
  iVar1 = (*node->_vptr_TIntermNode[0xf])();
  local_19 = false;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*node->_vptr_TIntermNode[0xf])();
    uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x160))();
    local_19 = false;
    if ((uVar2 & 1) != 0) {
      iVar1 = (*node->_vptr_TIntermNode[0x12])();
      local_1a = true;
      if (CONCAT44(extraout_var_01,iVar1) != 0) {
        iVar1 = (*node->_vptr_TIntermNode[0x12])();
        TVar3 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_02,iVar1));
        local_1a = TVar3 != EOpNull;
      }
      local_19 = local_1a;
    }
  }
  return local_19;
}

Assistant:

bool HlslParseContext::isScalarConstructor(const TIntermNode* node)
{
    // Obviously, it must be a scalar, but an aggregate node might not be fully
    // completed yet: holding a sequence of initializers under an aggregate
    // would not yet be typed, so don't check it's type.  This corresponds to
    // the aggregate operator also not being set yet. (An aggregate operation
    // that legitimately yields a scalar will have a getOp() of that operator,
    // not EOpNull.)

    return node->getAsTyped() != nullptr &&
           node->getAsTyped()->isScalar() &&
           (node->getAsAggregate() == nullptr || node->getAsAggregate()->getOp() != EOpNull);
}